

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O1

void __thiscall ON_ClippingPlaneDataList::~ON_ClippingPlaneDataList(ON_ClippingPlaneDataList *this)

{
  ON_ClippingPlaneData *pOVar1;
  long lVar2;
  
  if (0 < (this->m_list).m_count) {
    lVar2 = 0;
    do {
      pOVar1 = (this->m_list).m_a[lVar2];
      if (pOVar1 != (ON_ClippingPlaneData *)0x0) {
        ON_SimpleArray<int>::~ON_SimpleArray(&pOVar1->m_layer_list);
        ON_UuidList::~ON_UuidList(&pOVar1->m_object_id_list);
        operator_delete(pOVar1,0x50);
      }
      (this->m_list).m_a[lVar2] = (ON_ClippingPlaneData *)0x0;
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->m_list).m_count);
  }
  ON_SimpleArray<ON_ClippingPlaneData_*>::~ON_SimpleArray(&this->m_list);
  return;
}

Assistant:

ON_ClippingPlaneDataList::~ON_ClippingPlaneDataList()
{
  for(int i=0; i<m_list.Count(); i++)
  {
    ON_ClippingPlaneData* data = m_list[i];
    if (data)
      delete data;
    m_list[i] = nullptr;
  }
}